

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_write_all_coc
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  opj_tccp_t *poVar1;
  OPJ_UINT32 OVar2;
  OPJ_BYTE *p_buffer;
  OPJ_SIZE_T OVar3;
  opj_image_t *poVar4;
  ulong uVar5;
  OPJ_UINT32 p_comp_no;
  uint uVar6;
  opj_event_mgr *in_R9;
  ulong uVar7;
  undefined4 local_6c;
  opj_stream_private *local_68;
  opj_event_mgr *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  opj_tcp_t *local_40;
  long local_38;
  
  local_68 = p_stream;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x14dd,
                  "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager == (opj_event_mgr *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x14de,
                  "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_stream == (opj_stream_private *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x14df,
                  "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  poVar4 = p_j2k->m_private_image;
  uVar5 = (ulong)poVar4->numcomps;
  if (1 < poVar4->numcomps) {
    uVar7 = 1;
    local_58 = 0x7e8;
    local_60 = p_manager;
    do {
      poVar1 = (p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].tccps;
      local_38 = uVar7 * 0x438;
      if (((((poVar1->csty == poVar1[uVar7].csty) &&
            (uVar6 = poVar1->numresolutions, uVar6 == poVar1[uVar7].numresolutions)) &&
           (in_R9 = (opj_event_mgr *)(ulong)poVar1->cblkw, poVar1->cblkw == poVar1[uVar7].cblkw)) &&
          ((in_R9 = (opj_event_mgr *)(ulong)poVar1->cblkh, poVar1->cblkh == poVar1[uVar7].cblkh &&
           (in_R9 = (opj_event_mgr *)(ulong)poVar1->cblksty,
           poVar1->cblksty == poVar1[uVar7].cblksty)))) &&
         (in_R9 = (opj_event_mgr *)(ulong)poVar1->qmfbid, poVar1->qmfbid == poVar1[uVar7].qmfbid)) {
        if ((opj_event_mgr *)(ulong)uVar6 != (opj_event_mgr *)0x0) {
          in_R9 = (opj_event_mgr *)0x0;
          do {
            if ((poVar1->prcw[(long)in_R9] !=
                 *(OPJ_UINT32 *)((long)poVar1 + (long)in_R9 * 4 + local_58 + -0x84)) ||
               (poVar1->prch[(long)in_R9] !=
                *(OPJ_UINT32 *)((long)poVar1->stepsizes + (long)in_R9 * 4 + local_58 + -0x1c)))
            goto LAB_0011aa11;
            in_R9 = (opj_event_mgr *)((long)&in_R9->m_error_data + 1);
          } while ((opj_event_mgr *)(ulong)uVar6 != in_R9);
        }
      }
      else {
LAB_0011aa11:
        p_comp_no = (OPJ_UINT32)uVar7;
        OVar2 = opj_j2k_get_SPCod_SPCoc_size(p_j2k,p_j2k->m_current_tile_number,p_comp_no);
        uVar6 = OVar2 + (7 - (uint)((uint)uVar5 < 0x101));
        uVar5 = (ulong)uVar6;
        p_buffer = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
        if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar6) {
          p_buffer = (OPJ_BYTE *)opj_realloc(p_buffer,uVar5);
          if (p_buffer == (OPJ_BYTE *)0x0) {
            opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
            (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
            (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
            opj_event_msg(p_manager,1,"Not enough memory to write COC marker\n");
            return 0;
          }
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data = p_buffer;
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar6;
        }
        local_40 = (p_j2k->m_cp).tcps;
        local_48 = (ulong)p_j2k->m_current_tile_number;
        uVar6 = 2 - (p_j2k->m_private_image->numcomps < 0x101);
        OVar2 = opj_j2k_get_SPCod_SPCoc_size(p_j2k,p_j2k->m_current_tile_number,p_comp_no);
        local_50 = (ulong)OVar2;
        opj_write_bytes_LE(p_buffer,0xff53,2);
        opj_write_bytes_LE(p_buffer + 2,OVar2 + uVar6 + 3,2);
        opj_write_bytes_LE(p_buffer + 4,p_comp_no,uVar6);
        opj_write_bytes_LE(p_buffer + (ulong)uVar6 + 4,
                           *(OPJ_UINT32 *)
                            ((long)(local_40[local_48].tccps)->stepsizes + local_38 + -0x1c),1);
        p_manager = local_60;
        local_6c = (undefined4)local_50;
        opj_j2k_write_SPCod_SPCoc
                  (p_j2k,p_j2k->m_current_tile_number,uVar6 + (int)p_buffer + 5,
                   (OPJ_BYTE *)&local_6c,(OPJ_UINT32 *)local_60,in_R9);
        OVar3 = opj_stream_write_data
                          (local_68,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,uVar5,
                           p_manager);
        if (OVar3 != uVar5) {
          return 0;
        }
        poVar4 = p_j2k->m_private_image;
      }
      uVar7 = uVar7 + 1;
      uVar5 = (ulong)poVar4->numcomps;
      local_58 = local_58 + 0x438;
    } while (uVar7 < uVar5);
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_j2k_write_all_coc(
    opj_j2k_t *p_j2k,
    struct opj_stream_private *p_stream,
    struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 compno;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    for (compno = 1; compno < p_j2k->m_private_image->numcomps; ++compno) {
        /* cod is first component of first tile */
        if (! opj_j2k_compare_coc(p_j2k, 0, compno)) {
            if (! opj_j2k_write_coc(p_j2k, compno, p_stream, p_manager)) {
                return OPJ_FALSE;
            }
        }
    }

    return OPJ_TRUE;
}